

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O2

string * std::format<bool,bool,bool,bool,int>
                   (string *__return_storage_ptr__,string_view fmt,bool *ts,bool *ts_1,bool *ts_2,
                   bool *ts_3,int *ts_4)

{
  char *pcVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  bool *local_3c0;
  size_t local_3b8;
  char *local_3b0;
  long local_3a8;
  char *local_3a0;
  long local_398;
  char *local_390;
  long local_388;
  char *local_380;
  long local_378;
  char *local_370;
  long alStack_368 [54];
  stringstream ss;
  ostream local_1a8 [376];
  
  pcVar6 = fmt._M_str;
  local_3c0 = ts_1;
  memset(&local_3b8,0,0x200);
  uVar2 = 0;
  pcVar5 = pcVar6;
  for (sVar7 = 0; fmt._M_len != sVar7; sVar7 = sVar7 + 1) {
    pcVar1 = pcVar6 + sVar7;
    pcVar4 = pcVar1;
    if ((*pcVar1 != '}') && (pcVar4 = pcVar5, *pcVar1 == '{')) {
      if (pcVar5 == pcVar6) {
        (&local_3b8)[uVar2 * 2] = sVar7;
        (&local_3b0)[uVar2 * 2] = pcVar6;
        uVar2 = uVar2 + 1;
        pcVar4 = pcVar6;
      }
      else if (uVar2 < 0x20 && pcVar1 != pcVar5) {
        (&local_3b8)[uVar2 * 2] = (size_t)(pcVar6 + ((sVar7 - 1) - (long)pcVar5));
        (&local_3b0)[uVar2 * 2] = pcVar5 + 1;
        uVar2 = uVar2 + 1;
      }
    }
    pcVar5 = pcVar4;
  }
  pcVar5 = pcVar5 + 1;
  if (pcVar5 != pcVar6 + fmt._M_len) {
    (&local_3b8)[uVar2 * 2] = (long)(pcVar6 + fmt._M_len) - (long)pcVar5;
    (&local_3b0)[uVar2 * 2] = pcVar5;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,local_3b8);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3a0,local_3a8);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_390,local_398);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_380,local_388);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_370,local_378);
  std::ostream::operator<<(poVar3,*ts_4);
  for (lVar8 = 0x58; lVar8 != 0x208; lVar8 = lVar8 + 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)&local_3b8 + lVar8),*(long *)((long)&local_3c0 + lVar8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}